

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::core::ConfidentialTransaction::GetTxInIndex
          (ConfidentialTransaction *this,Txid *txid,uint32_t vout)

{
  ulong uVar1;
  bool bVar2;
  uint32_t uVar3;
  size_type sVar4;
  const_reference pvVar5;
  CfdException *this_00;
  bool bVar6;
  uint local_bc;
  allocator local_a9;
  string local_a8;
  CfdSourceLocation local_88;
  Txid local_60;
  ulong local_40;
  size_t i;
  long lStack_30;
  uint32_t index;
  size_t is_coinbase;
  wally_tx *tx_pointer;
  Txid *pTStack_18;
  uint32_t vout_local;
  Txid *txid_local;
  ConfidentialTransaction *this_local;
  
  is_coinbase = (size_t)(this->super_AbstractTransaction).wally_tx_pointer_;
  lStack_30 = 0;
  tx_pointer._4_4_ = vout;
  pTStack_18 = txid;
  txid_local = (Txid *)this;
  wally_tx_is_coinbase(is_coinbase,&stack0xffffffffffffffd0);
  if (lStack_30 == 0) {
    local_bc = tx_pointer._4_4_ & 0x3fffffff;
  }
  else {
    local_bc = tx_pointer._4_4_;
  }
  i._4_4_ = local_bc;
  local_40 = 0;
  while( true ) {
    uVar1 = local_40;
    sVar4 = ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
            ::size(&this->vin_);
    if (sVar4 <= uVar1) {
      local_88.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                   ,0x2f);
      local_88.filename = local_88.filename + 1;
      local_88.line = 0x5b9;
      local_88.funcname = "GetTxInIndex";
      logger::warn<>(&local_88,"Txid is not found.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_a8,"Txid is not found.",&local_a9);
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_a8);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    pvVar5 = ::std::
             vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
             operator[](&this->vin_,local_40);
    AbstractTxIn::GetTxid(&local_60,&pvVar5->super_AbstractTxIn);
    bVar2 = Txid::Equals(&local_60,pTStack_18);
    bVar6 = false;
    if (bVar2) {
      pvVar5 = ::std::
               vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
               operator[](&this->vin_,local_40);
      uVar3 = AbstractTxIn::GetVout(&pvVar5->super_AbstractTxIn);
      bVar6 = uVar3 == i._4_4_;
    }
    Txid::~Txid(&local_60);
    if (bVar6) break;
    local_40 = local_40 + 1;
  }
  return (uint32_t)local_40;
}

Assistant:

uint32_t ConfidentialTransaction::GetTxInIndex(
    const Txid &txid, uint32_t vout) const {
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  size_t is_coinbase = 0;
  wally_tx_is_coinbase(tx_pointer, &is_coinbase);

  uint32_t index = (is_coinbase == 0) ? vout & kTxInVoutMask : vout;
  for (size_t i = 0; i < vin_.size(); ++i) {
    if (vin_[i].GetTxid().Equals(txid) && vin_[i].GetVout() == index) {
      return static_cast<uint32_t>(i);
    }
  }
  warn(CFD_LOG_SOURCE, "Txid is not found.");
  throw CfdException(kCfdIllegalArgumentError, "Txid is not found.");
}